

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<TPZEqnArray<long_double>_> * __thiscall
TPZVec<TPZEqnArray<long_double>_>::operator=
          (TPZVec<TPZEqnArray<long_double>_> *this,TPZVec<TPZEqnArray<long_double>_> *rval)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int64_t i;
  TPZEqnArray<long_double> *pTVar8;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    pTVar8 = this->fStore;
    if (pTVar8 != (TPZEqnArray<long_double> *)0x0) {
      lVar6 = *(long *)&pTVar8[-1].field_0x51d8;
      if (lVar6 != 0) {
        lVar5 = lVar6 * 0x51e0;
        do {
          TPZEqnArray<long_double>::~TPZEqnArray
                    ((TPZEqnArray<long_double> *)
                     ((long)pTVar8[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                     lVar5 + -0x28));
          lVar5 = lVar5 + -0x51e0;
        } while (lVar5 != 0);
      }
      operator_delete__(&pTVar8[-1].fLastTerm,lVar6 * 0x51e0 | 0x10);
    }
    if (rval->fNAlloc == 0) {
      uVar1 = this->fNElements;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar1;
      uVar7 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x51e0),8) == 0) {
        uVar7 = SUB168(auVar2 * ZEXT816(0x51e0),0) | 0x10;
      }
      pvVar4 = operator_new__(uVar7);
      *(ulong *)((long)pvVar4 + 8) = uVar1;
      if (uVar1 != 0) {
        lVar6 = 0;
        pTVar8 = (TPZEqnArray<long_double> *)((long)pvVar4 + 0x10);
        do {
          TPZEqnArray<long_double>::TPZEqnArray(pTVar8);
          lVar6 = lVar6 + -0x51e0;
          pTVar8 = pTVar8 + 1;
        } while (uVar1 * -0x51e0 - lVar6 != 0);
      }
      this->fStore = (TPZEqnArray<long_double> *)((long)pvVar4 + 0x10);
      lVar5 = 0;
      for (lVar6 = 0; lVar3 = this->fNElements, lVar6 < lVar3; lVar6 = lVar6 + 1) {
        TPZEqnArray<long_double>::operator=
                  ((TPZEqnArray<long_double> *)
                   ((long)(this->fStore->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                   lVar5 + -0x28),
                   (TPZEqnArray<long_double> *)
                   ((long)(rval->fStore->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                   lVar5 + -0x28));
        lVar5 = lVar5 + 0x51e0;
      }
    }
    else {
      this->fStore = rval->fStore;
      lVar3 = this->fNElements;
    }
    this->fNAlloc = lVar3;
    rval->fStore = (TPZEqnArray<long_double> *)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}